

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_facelift.c
# Opt level: O0

REF_STATUS ref_facelift_max_distance(REF_FACELIFT ref_facelift,REF_DBL *distance)

{
  int iVar1;
  REF_NODE pRVar2;
  REF_GEOM pRVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  REF_DBL local_60;
  int local_40;
  int local_3c;
  REF_INT node;
  REF_INT geom;
  REF_GEOM ref_geom;
  REF_NODE ref_node;
  REF_GRID ref_grid;
  REF_DBL *distance_local;
  REF_FACELIFT ref_facelift_local;
  
  pRVar2 = ref_facelift->grid->node;
  pRVar3 = ref_facelift->grid->geom;
  if (ref_facelift->displacement == (REF_DBL *)0x0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",
           0x51f,"ref_facelift_max_distance","requires indirect facelift");
    ref_facelift_local._4_4_ = 1;
  }
  else {
    for (local_40 = 0; local_40 < pRVar2->max; local_40 = local_40 + 1) {
      if (((-1 < local_40) && (local_40 < pRVar2->max)) && (-1 < pRVar2->global[local_40])) {
        distance[local_40] = 0.0;
      }
    }
    for (local_3c = 0; local_3c < pRVar3->max; local_3c = local_3c + 1) {
      if (pRVar3->descr[local_3c * 6] != -1) {
        iVar1 = pRVar3->descr[local_3c * 6 + 5];
        dVar7 = distance[iVar1];
        dVar4 = pow(ref_facelift->displacement[local_3c * 3],2.0);
        dVar5 = pow(ref_facelift->displacement[local_3c * 3 + 1],2.0);
        dVar6 = pow(ref_facelift->displacement[local_3c * 3 + 2],2.0);
        dVar4 = sqrt(dVar4 + dVar5 + dVar6);
        if (dVar7 <= dVar4) {
          dVar7 = pow(ref_facelift->displacement[local_3c * 3],2.0);
          dVar4 = pow(ref_facelift->displacement[local_3c * 3 + 1],2.0);
          dVar5 = pow(ref_facelift->displacement[local_3c * 3 + 2],2.0);
          local_60 = sqrt(dVar7 + dVar4 + dVar5);
        }
        else {
          local_60 = distance[iVar1];
        }
        distance[iVar1] = local_60;
      }
    }
    ref_facelift_local._4_4_ = 0;
  }
  return ref_facelift_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_facelift_max_distance(REF_FACELIFT ref_facelift,
                                             REF_DBL *distance) {
  REF_GRID ref_grid = ref_facelift_grid(ref_facelift);
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_GEOM ref_geom = ref_facelift_geom(ref_facelift);
  REF_INT geom, node;

  RAS(!ref_facelift_direct(ref_facelift), "requires indirect facelift");

  each_ref_node_valid_node(ref_node, node) { distance[node] = 0.0; }

  each_ref_geom(ref_geom, geom) {
    node = ref_geom_node(ref_geom, geom);
    distance[node] =
        MAX(distance[node], ref_facelift_distance(ref_facelift, geom));
  }

  return REF_SUCCESS;
}